

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O1

void __thiscall leveldb::anon_unknown_0::ShardedLRUCache::Erase(ShardedLRUCache *this,Slice *key)

{
  uint32_t *puVar1;
  long lVar2;
  LRUHandle *e;
  uint32_t hash;
  uint uVar3;
  int iVar4;
  LRUHandle **ppLVar5;
  undefined8 uVar6;
  Mutex *__mutex;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  hash = Hash(key->data_,key->size_,0);
  uVar3 = hash >> 0x1c;
  __mutex = &this->shard_[uVar3].mutex_;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar4 == 0) {
    ppLVar5 = HandleTable::FindPointer(&this->shard_[uVar3].table_,key,hash);
    e = *ppLVar5;
    if (e != (LRUHandle *)0x0) {
      *ppLVar5 = e->next_hash;
      puVar1 = &this->shard_[uVar3].table_.elems_;
      *puVar1 = *puVar1 - 1;
    }
    LRUCache::FinishErase(this->shard_ + uVar3,e);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    uVar6 = std::__throw_system_error(iVar4);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      _Unwind_Resume(uVar6);
    }
  }
  __stack_chk_fail();
}

Assistant:

void Erase(const Slice& key) override {
    const uint32_t hash = HashSlice(key);
    shard_[Shard(hash)].Erase(key, hash);
  }